

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O2

logical ga_locate_region_(Integer *g_a,Integer *ilo,Integer *ihi,Integer *jlo,Integer *jhi,
                         Integer (*map) [5],Integer *np)

{
  undefined1 auVar1 [16];
  Integer IVar2;
  Integer *proclist;
  Integer *map_00;
  logical lVar3;
  long lVar4;
  Integer *pIVar5;
  Integer *pIVar6;
  undefined1 auVar7 [16];
  Integer hi [2];
  Integer lo [2];
  Integer local_58;
  Integer local_50;
  Integer local_48;
  Integer local_40;
  
  IVar2 = pnga_nnodes();
  proclist = (Integer *)malloc(IVar2 * 8);
  IVar2 = pnga_nnodes();
  map_00 = (Integer *)malloc(IVar2 * 0x28);
  local_48 = *ilo;
  local_40 = *jlo;
  local_58 = *ihi;
  local_50 = *jhi;
  IVar2 = pnga_locate_num_blocks(*g_a,&local_48,&local_58);
  if (IVar2 == -1) {
    lVar3 = pnga_locate_region(*g_a,&local_48,&local_58,map_00,proclist,np);
    pIVar6 = *map + 4;
    pIVar5 = map_00;
    for (lVar4 = 0; lVar4 < *np; lVar4 = lVar4 + 1) {
      (*(Integer (*) [5])(pIVar6 + -4))[0] = *pIVar5;
      auVar1 = *(undefined1 (*) [16])(pIVar5 + 1);
      auVar7._0_8_ = auVar1._8_8_;
      auVar7._8_4_ = auVar1._0_4_;
      auVar7._12_4_ = auVar1._4_4_;
      *(undefined1 (*) [16])(pIVar6 + -3) = auVar7;
      pIVar6[-1] = pIVar5[3];
      *pIVar6 = proclist[lVar4];
      pIVar5 = pIVar5 + 4;
      pIVar6 = pIVar6 + 5;
    }
  }
  else {
    lVar3 = 0;
    pnga_error("Must call nga_locate_region on block-cyclic data distribution",0);
  }
  free(proclist);
  free(map_00);
  return lVar3;
}

Assistant:

logical FATR ga_locate_region_( Integer *g_a,
                                Integer *ilo,
                                Integer *ihi,
                                Integer *jlo,
                                Integer *jhi,
                                Integer map[][5],
                                Integer *np)
{
  logical status = FALSE;
  Integer lo[2], hi[2], p;
  Integer *mapl, *proclist;
  proclist = (Integer*)malloc(wnga_nnodes()*sizeof(Integer));
  mapl = (Integer*)malloc(5*wnga_nnodes()*sizeof(Integer));
  lo[0] = *ilo;
  lo[1] = *jlo;
  hi[0] = *ihi;
  hi[1] = *jhi;
  if (wnga_locate_num_blocks(*g_a, lo, hi) == -1) {
    status = wnga_locate_region(*g_a, lo, hi, mapl, proclist, np);
    /* need to swap elements (ilo,jlo,ihi,jhi) -> (ilo,ihi,jlo,jhi) */
    for(p = 0; p< *np; p++){
      map[p][0] = mapl[4*p];
      map[p][1] = mapl[4*p + 2];
      map[p][2] = mapl[4*p + 1];
      map[p][3] = mapl[4*p + 3];
      map[p][4] = proclist[p];
    }
  } else {
    wnga_error("Must call nga_locate_region on block-cyclic data distribution",0);
  }
  free(proclist);
  free(mapl);
  return status;
}